

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

int Bal_ManFindBestPair(Bal_Man_t *p,Vec_Int_t *vSuper,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int fIsXor;
  int iVar4;
  int iVar5;
  int *piVar6;
  int local_4c;
  int Cost;
  int BestCost;
  int kBest;
  int iBest;
  int k;
  int i;
  int iEnd;
  int iBeg;
  int *pSuper;
  Gia_Obj_t *pObj_local;
  Vec_Int_t *vSuper_local;
  Bal_Man_t *p_local;
  
  piVar6 = Vec_IntArray(vSuper);
  iVar1 = Vec_IntFindFirstSameDelayAsLast(p,vSuper);
  iVar2 = Vec_IntSize(vSuper);
  iVar3 = iVar2 + -1;
  BestCost = -1;
  Cost = -1;
  local_4c = 1000000000;
  kBest = iVar1;
  if (iVar3 < iVar1) {
    __assert_fail("iBeg <= iEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaBalLut.c"
                  ,0x268,"int Bal_ManFindBestPair(Bal_Man_t *, Vec_Int_t *, Gia_Obj_t *)");
  }
  while (kBest = kBest + -1, iBest = iVar3, -1 < kBest) {
    for (; iVar1 <= iBest; iBest = iBest + -1) {
      iVar4 = piVar6[iBest];
      iVar5 = piVar6[kBest];
      fIsXor = Gia_ObjIsXor(pObj);
      iVar4 = Bal_ManEvalTwo(p,iVar4,iVar5,0,fIsXor);
      if (iVar4 != -1) {
        iVar5 = Bal_LitCost(p,piVar6[kBest]);
        if (iVar4 == iVar5) {
          return kBest * 0x10000 | iBest;
        }
        if (iVar4 < local_4c) {
          BestCost = iBest;
          Cost = kBest;
          local_4c = iVar4;
        }
      }
    }
  }
  if ((local_4c == 1000000000) || (iVar4 = Bal_LitDelay(p,piVar6[Cost]), local_4c >> 4 != iVar4)) {
    local_4c = 1000000000;
    for (iBest = iVar1; kBest = iBest, iBest <= iVar3; iBest = iBest + 1) {
      while (kBest = kBest + 1, kBest <= iVar3) {
        iVar1 = piVar6[iBest];
        iVar4 = piVar6[kBest];
        iVar5 = Gia_ObjIsXor(pObj);
        iVar1 = Bal_ManEvalTwo(p,iVar1,iVar4,0,iVar5);
        if (iVar1 != -1) {
          iVar4 = Bal_LitCost(p,piVar6[iBest]);
          iVar5 = Bal_LitCost(p,piVar6[kBest]);
          iVar4 = Abc_MaxInt(iVar4,iVar5);
          if (iVar1 == iVar4) {
            return kBest * 0x10000 | iBest;
          }
          if (iVar1 < local_4c) {
            BestCost = iBest;
            Cost = kBest;
            local_4c = iVar1;
          }
        }
      }
    }
    if (local_4c == 1000000000) {
      p_local._4_4_ = iVar3 * 0x10000 | iVar2 - 2U;
    }
    else {
      p_local._4_4_ = Cost << 0x10 | BestCost;
    }
  }
  else {
    p_local._4_4_ = Cost << 0x10 | BestCost;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Bal_ManFindBestPair( Bal_Man_t * p, Vec_Int_t * vSuper, Gia_Obj_t * pObj )
{
    int * pSuper = Vec_IntArray(vSuper);
    int iBeg = Vec_IntFindFirstSameDelayAsLast( p, vSuper );
    int iEnd = Vec_IntSize(vSuper)-1;
    int i, k, iBest = -1, kBest = -1, BestCost = ABC_INFINITY, Cost;
    assert( iBeg <= iEnd );
    // check if we can add to the higher levels without increasing cost
    for ( k = iBeg-1; k >= 0; k-- )
    for ( i = iEnd; i >= iBeg; i-- )
    {
        Cost = Bal_ManEvalTwo( p, pSuper[i], pSuper[k], 0, Gia_ObjIsXor(pObj) );
        if ( Cost == -1 )
            continue;
        if ( Cost == Bal_LitCost(p, pSuper[k]) )
        {
//            printf( "A" );
            return (k << 16)|i;
        }
        if ( BestCost > Cost )
            BestCost = Cost, iBest = i, kBest = k;
    }
    if ( BestCost != ABC_INFINITY && (BestCost >> 4) == Bal_LitDelay(p, pSuper[kBest]) )
    {
//        printf( "B" );
        return (kBest << 16)|iBest;
    }
    // check if some can be added to lowest level without increasing cost
    BestCost = ABC_INFINITY;
    for ( i = iBeg; i <= iEnd; i++ )
    for ( k = i+1;  k <= iEnd; k++ )
    {
        Cost = Bal_ManEvalTwo( p, pSuper[i], pSuper[k], 0, Gia_ObjIsXor(pObj) );
        if ( Cost == -1 )
            continue;
        if ( Cost == Abc_MaxInt(Bal_LitCost(p, pSuper[i]), Bal_LitCost(p, pSuper[k])) )
        {
//            printf( "C" );
            return (k << 16)|i;
        }
        if ( BestCost > Cost )
            BestCost = Cost, iBest = i, kBest = k;
    }
    if ( BestCost != ABC_INFINITY )
    {
//        printf( "D" );
        return (kBest << 16)|iBest;
    }
//    printf( "E" );
    // group pairs from lowest level based on proximity
    return (iEnd << 16)|(iEnd-1);
}